

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest::~CpuAbsoluteIndexedTest
          (CpuAbsoluteIndexedTest *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void run_read_instruction_without_pagecrossing(uint8_t instruction,
            IndexReg index_reg) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const uint8_t index_reg_value{0x10};
        set_index_reg(index_reg, index_reg_value);

        const uint16_t effective_address = 0x5678 + index_reg_value;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x78));
        EXPECT_CALL(mmu, read_byte(start_pc + 2u)).WillOnce(Return(0x56));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));

        step_execution(4);
        EXPECT_EQ(expected, registers);
    }